

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributeBackToSignedType<int>
          (KdTreeAttributesDecoder *this,PointAttribute *att,int num_processed_signed_components)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_val;
  vector<int,_std::allocator<int>_> signed_val;
  allocator_type local_61;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
             (ulong)(att->super_GeometryAttribute).num_components_,(allocator_type *)&local_48);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,
             (ulong)(att->super_GeometryAttribute).num_components_,&local_61);
  for (uVar6 = 0; uVar2 = att->num_unique_entries_, uVar6 < uVar2; uVar6 = uVar6 + 1) {
    sVar3 = (att->super_GeometryAttribute).byte_stride_;
    memcpy(local_60._M_impl.super__Vector_impl_data._M_start,
           (void *)((long)(((att->super_GeometryAttribute).buffer_)->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                    (att->super_GeometryAttribute).byte_offset_ + sVar3 * uVar6),sVar3);
    bVar1 = (att->super_GeometryAttribute).num_components_;
    piVar4 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar5 = 0; bVar1 != uVar5; uVar5 = uVar5 + 1) {
      if ((int)local_60._M_impl.super__Vector_impl_data._M_start[uVar5] < 0) goto LAB_00139136;
      local_48._M_impl.super__Vector_impl_data._M_start[uVar5] =
           local_60._M_impl.super__Vector_impl_data._M_start[uVar5] +
           piVar4[(long)num_processed_signed_components + uVar5];
    }
    sVar3 = (att->super_GeometryAttribute).byte_stride_;
    memcpy((void *)(sVar3 * uVar6 +
                   (long)(((att->super_GeometryAttribute).buffer_)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start),
           local_48._M_impl.super__Vector_impl_data._M_start,sVar3);
  }
LAB_00139136:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  return uVar2 <= uVar6;
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributeBackToSignedType(
    PointAttribute *att, int num_processed_signed_components) {
  typedef typename std::make_unsigned<SignedDataTypeT>::type UnsignedType;
  std::vector<UnsignedType> unsigned_val(att->num_components());
  std::vector<SignedDataTypeT> signed_val(att->num_components());

  for (AttributeValueIndex avi(0); avi < static_cast<uint32_t>(att->size());
       ++avi) {
    att->GetValue(avi, &unsigned_val[0]);
    for (int c = 0; c < att->num_components(); ++c) {
      // Up-cast |unsigned_val| to int32_t to ensure we don't overflow it for
      // smaller data types. But first check that the up-casting does not cause
      // signed integer overflow.
      if (unsigned_val[c] > std::numeric_limits<int32_t>::max()) {
        return false;
      }
      signed_val[c] = static_cast<SignedDataTypeT>(
          static_cast<int32_t>(unsigned_val[c]) +
          min_signed_values_[num_processed_signed_components + c]);
    }
    att->SetAttributeValue(avi, &signed_val[0]);
  }
  return true;
}